

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  LazyDescriptor *pLVar1;
  HasBits<1> *pHVar2;
  ushort *puVar3;
  once_flag *poVar4;
  char *pcVar5;
  FeatureSet *from;
  string *psVar6;
  MethodOptions *pMVar7;
  MethodOptions *pMVar8;
  FeatureSet *pFVar9;
  Arena *pAVar10;
  anon_class_16_2_d159f980 *fn_00;
  anon_class_16_2_d159f980 *fn_01;
  anon_class_16_2_d159f980 *fn_02;
  string_view value;
  string_view value_00;
  string_view value_01;
  ServiceDescriptor *local_58;
  AlphaNum local_50;
  anon_class_16_2_d159f980 *fn;
  
  puVar3 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar3;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar3 + ~value._M_len);
  pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar10);
  pLVar1 = &this->input_type_;
  local_58 = this->service_;
  poVar4 = (this->input_type_).once_;
  if (poVar4 != (once_flag *)0x0) {
    local_50.piece_._M_len = (size_t)&local_58;
    local_50.piece_._M_str = (char *)pLVar1;
    if ((poVar4->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
      local_50.piece_._M_len = (size_t)&local_58;
      absl::lts_20250127::base_internal::
      CallOnceImpl<google::protobuf::internal::LazyDescriptor::Once(google::protobuf::ServiceDescriptor_const*)::__0>
                (&poVar4->control_,(SchedulingMode)&local_50,fn);
    }
  }
  if ((pLVar1->descriptor_->field_0x1 & 2) == 0) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    value_00._M_str = ".";
    value_00._M_len = 1;
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.input_type_,value_00,pAVar10);
  }
  *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
  pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  psVar6 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                     (&(proto->field_0)._impl_.input_type_,pAVar10);
  local_58 = this->service_;
  poVar4 = (this->input_type_).once_;
  if (poVar4 != (once_flag *)0x0) {
    if ((poVar4->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
      local_50.piece_._M_len = (size_t)&local_58;
      local_50.piece_._M_str = (char *)pLVar1;
      absl::lts_20250127::base_internal::
      CallOnceImpl<google::protobuf::internal::LazyDescriptor::Once(google::protobuf::ServiceDescriptor_const*)::__0>
                (&poVar4->control_,(SchedulingMode)&local_50,fn_00);
    }
  }
  pcVar5 = (((this->input_type_).descriptor_)->all_names_).payload_;
  local_50.piece_._M_len = (size_t)*(ushort *)(pcVar5 + 2);
  local_50.piece_._M_str = pcVar5 + ~local_50.piece_._M_len;
  absl::lts_20250127::StrAppend(psVar6,&local_50);
  pLVar1 = &this->output_type_;
  local_58 = this->service_;
  poVar4 = (this->output_type_).once_;
  if (poVar4 != (once_flag *)0x0) {
    local_50.piece_._M_len = (size_t)&local_58;
    local_50.piece_._M_str = (char *)pLVar1;
    if ((poVar4->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
      local_50.piece_._M_len = (size_t)&local_58;
      absl::lts_20250127::base_internal::
      CallOnceImpl<google::protobuf::internal::LazyDescriptor::Once(google::protobuf::ServiceDescriptor_const*)::__0>
                (&poVar4->control_,(SchedulingMode)&local_50,fn_01);
    }
  }
  if ((pLVar1->descriptor_->field_0x1 & 2) == 0) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
    pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    value_01._M_str = ".";
    value_01._M_len = 1;
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.output_type_,value_01,pAVar10);
  }
  *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
  pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  psVar6 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                     (&(proto->field_0)._impl_.output_type_,pAVar10);
  local_58 = this->service_;
  poVar4 = (this->output_type_).once_;
  if (poVar4 != (once_flag *)0x0) {
    if ((poVar4->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
      local_50.piece_._M_len = (size_t)&local_58;
      local_50.piece_._M_str = (char *)pLVar1;
      absl::lts_20250127::base_internal::
      CallOnceImpl<google::protobuf::internal::LazyDescriptor::Once(google::protobuf::ServiceDescriptor_const*)::__0>
                (&poVar4->control_,(SchedulingMode)&local_50,fn_02);
    }
  }
  pcVar5 = (((this->output_type_).descriptor_)->all_names_).payload_;
  local_50.piece_._M_len = (size_t)*(ushort *)(pcVar5 + 2);
  local_50.piece_._M_str = pcVar5 + ~local_50.piece_._M_len;
  absl::lts_20250127::StrAppend(psVar6,&local_50);
  pMVar8 = this->options_;
  if (pMVar8 != (MethodOptions *)_MethodOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 8;
    if ((proto->field_0)._impl_.options_ == (MethodOptions *)0x0) {
      pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      pMVar7 = (MethodOptions *)Arena::DefaultConstruct<google::protobuf::MethodOptions>(pAVar10);
      (proto->field_0)._impl_.options_ = pMVar7;
    }
    MethodOptions::CopyFrom((proto->field_0)._impl_.options_,pMVar8);
  }
  if (this->client_streaming_ == true) {
    (proto->field_0)._impl_.client_streaming_ = true;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x10;
  }
  if (this->server_streaming_ == true) {
    (proto->field_0)._impl_.server_streaming_ = true;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x20;
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 8;
    if ((proto->field_0)._impl_.options_ == (MethodOptions *)0x0) {
      pAVar10 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      pMVar8 = (MethodOptions *)Arena::DefaultConstruct<google::protobuf::MethodOptions>(pAVar10);
      (proto->field_0)._impl_.options_ = pMVar8;
    }
    pMVar8 = (proto->field_0)._impl_.options_;
    pHVar2 = &(pMVar8->field_0)._impl_._has_bits_;
    pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 1;
    if ((pMVar8->field_0)._impl_.features_ == (FeatureSet *)0x0) {
      pAVar10 = (Arena *)(pMVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      pFVar9 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar10);
      (pMVar8->field_0)._impl_.features_ = pFVar9;
    }
    FeatureSet::CopyFrom((pMVar8->field_0)._impl_.features_,from);
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  absl::StrAppend(proto->mutable_input_type(), input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  absl::StrAppend(proto->mutable_output_type(), output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    *proto->mutable_options() = options();
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}